

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::ComputeLinkImplementationLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkImplementation *impl,
          cmGeneratorTarget *head)

{
  cmTarget *pcVar1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  int iVar3;
  PolicyStatus PVar4;
  char *pcVar5;
  ostream *poVar6;
  cmake *pcVar7;
  _Rb_tree_node_base *p_Var8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  cmGeneratorTarget *pcVar10;
  pointer ppVar11;
  PolicyID id;
  pointer item;
  cmTargetLinkLibraryType cVar12;
  MessageType t;
  pointer item_00;
  bool bVar13;
  cmStringRange cVar14;
  cmBacktraceRange cVar15;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  llibs;
  string evaluated;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  ostringstream e;
  cmGeneratorExpressionDAGChecker dagChecker;
  const_iterator local_3b8;
  auto_ptr<cmCompiledGeneratorExpression> local_3b0;
  cmOptionalLinkImplementation *local_3a8;
  cmListFileBacktrace *local_3a0;
  string local_398;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  string local_360;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_340;
  string *local_338;
  const_iterator local_330;
  cmGeneratorTarget *local_328;
  PolicyMap *local_320;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_318;
  string local_310;
  cmListFileBacktrace local_2f0;
  cmGeneratorExpression local_2b0;
  undefined1 local_270 [16];
  undefined1 local_260 [360];
  undefined1 local_f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_b0;
  cmListFileBacktrace local_78;
  
  local_3a8 = impl;
  local_328 = head;
  cVar14 = cmTarget::GetLinkImplementationEntries_abi_cxx11_(this->Target);
  cVar15 = cmTarget::GetLinkImplementationBacktraces(this->Target);
  local_3a0 = (cmListFileBacktrace *)cVar15.Begin._M_current;
  local_330._M_current = cVar14.End._M_current._M_current;
  if (cVar14.Begin._M_current._M_current != cVar14.End._M_current._M_current) {
    local_320 = &this->PolicyMap;
    local_318 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)&this->LinkImplicitNullProperties;
    local_340 = &this->MaxLanguageStandards;
    local_338 = config;
    do {
      local_330 = cVar14.End._M_current;
      local_3b8 = cVar14.Begin._M_current;
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar1 = this->Target;
      local_270._0_8_ = local_260;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"LINK_LIBRARIES","");
      cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                ((cmGeneratorExpressionDAGChecker *)local_f8,&pcVar1->Name,(string *)local_270,
                 (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
      if ((cmCompiledGeneratorExpression *)local_270._0_8_ !=
          (cmCompiledGeneratorExpression *)local_260) {
        operator_delete((void *)local_270._0_8_,CONCAT71(local_260._1_7_,local_260[0]) + 1);
      }
      cmGeneratorExpression::cmGeneratorExpression(&local_2b0,local_3a0);
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_270,(string *)&local_2b0);
      local_3b0.x_ = (cmCompiledGeneratorExpression *)local_270._0_8_;
      local_270._0_8_ = (pointer)0x0;
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)local_270);
      local_270._0_8_ = local_260;
      local_270._8_8_ = 0;
      local_260[0] = '\0';
      pcVar5 = cmCompiledGeneratorExpression::Evaluate
                         (local_3b0.x_,this->LocalGenerator,config,false,local_328,
                          (cmGeneratorExpressionDAGChecker *)local_f8,(string *)local_270);
      std::__cxx11::string::string((string *)&local_360,pcVar5,(allocator *)&local_2f0);
      if ((undefined1 *)local_270._0_8_ != local_260) {
        operator_delete((void *)local_270._0_8_,CONCAT71(local_260._1_7_,local_260[0]) + 1);
      }
      cmSystemTools::ExpandListArgument(&local_360,&local_378,false);
      if ((local_3b0.x_)->HadHeadSensitiveCondition == true) {
        local_3a8->HadHeadSensitiveCondition = true;
      }
      item_00 = local_378.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_378.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_378.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          CheckCMP0004(&local_398,this,item_00);
          if (local_398._M_string_length == (this->Target->Name)._M_string_length) {
            if ((local_398._M_string_length == 0) ||
               (iVar3 = bcmp(local_398._M_dataplus._M_p,(this->Target->Name)._M_dataplus._M_p,
                             local_398._M_string_length), iVar3 == 0)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
              PVar4 = cmPolicies::PolicyMap::Get(local_320,CMP0038);
              if (PVar4 == OLD) {
LAB_003e7c48:
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
                std::ios_base::~ios_base((ios_base *)(local_260 + 0x60));
                goto LAB_003e7c69;
              }
              if (PVar4 == WARN) {
                cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&local_2f0,(cmPolicies *)0x26,id);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_270,local_2f0.Context.Name._M_dataplus._M_p,
                                    local_2f0.Context.Name._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2f0.Context.Name._M_dataplus._M_p != &local_2f0.Context.Name.field_2) {
                  operator_delete(local_2f0.Context.Name._M_dataplus._M_p,
                                  local_2f0.Context.Name.field_2._M_allocated_capacity + 1);
                }
                bVar13 = false;
                t = AUTHOR_WARNING;
              }
              else {
                t = FATAL_ERROR;
                bVar13 = true;
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_270,"Target \"",8)
              ;
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_270,(this->Target->Name)._M_dataplus._M_p,
                                  (this->Target->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" links to itself.",0x12);
              pcVar7 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
              std::__cxx11::stringbuf::str();
              GetBacktrace(&local_2f0,this);
              cmake::IssueMessage(pcVar7,t,&local_310,&local_2f0,false);
              cmListFileBacktrace::~cmListFileBacktrace(&local_2f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_310._M_dataplus._M_p != &local_310.field_2) {
                operator_delete(local_310._M_dataplus._M_p,
                                local_310.field_2._M_allocated_capacity + 1);
              }
              if (!bVar13) goto LAB_003e7c48;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
              std::ios_base::~ios_base((ios_base *)(local_260 + 0x60));
              iVar3 = 1;
              goto LAB_003e7c6e;
            }
LAB_003e7b02:
            pcVar10 = FindTargetToLink(this,&local_398);
            bVar13 = true;
            if (local_360._M_string_length == (local_3b8._M_current)->_M_string_length) {
              if (local_360._M_string_length == 0) {
                bVar13 = false;
              }
              else {
                iVar3 = bcmp(local_360._M_dataplus._M_p,((local_3b8._M_current)->_M_dataplus)._M_p,
                             local_360._M_string_length);
                bVar13 = iVar3 != 0;
              }
            }
            cmLinkImplItem::cmLinkImplItem
                      ((cmLinkImplItem *)local_270,&local_398,pcVar10,local_3a0,bVar13);
            std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::
            emplace_back<cmLinkImplItem>
                      ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_3a8,
                       (cmLinkImplItem *)local_270);
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)(local_260 + 0x18));
            if ((undefined1 *)local_270._0_8_ != local_260) {
              operator_delete((void *)local_270._0_8_,CONCAT71(local_260._1_7_,local_260[0]) + 1);
            }
            iVar3 = 0;
            bVar13 = true;
          }
          else {
            if (local_398._M_string_length != 0) goto LAB_003e7b02;
LAB_003e7c69:
            iVar3 = 7;
LAB_003e7c6e:
            bVar13 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
          }
          if ((iVar3 != 7) && (iVar3 != 0)) goto LAB_003e7d86;
          item_00 = item_00 + 1;
        } while (item_00 !=
                 local_378.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      psVar2 = &(local_3b0.x_)->SeenTargetProperties;
      for (p_Var8 = ((local_3b0.x_)->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header.
                    _M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &(psVar2->_M_t)._M_impl.super__Rb_tree_header;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        pcVar5 = cmTarget::GetProperty(this->Target,(string *)(p_Var8 + 1));
        if (pcVar5 == (char *)0x0) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    (local_318,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var8 + 1));
        }
      }
      bVar13 = true;
      cmCompiledGeneratorExpression::GetMaxLanguageStandard(local_3b0.x_,this,local_340);
LAB_003e7d86:
      config = local_338;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_3b0);
      cmGeneratorExpression::~cmGeneratorExpression(&local_2b0);
      cmListFileBacktrace::~cmListFileBacktrace(&local_78);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_p != &local_c0) {
        operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._8_8_ != &local_e0) {
        operator_delete((void *)local_f8._8_8_,local_e0._0_8_ + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_378);
      if (!bVar13) {
        return;
      }
      local_3a0 = local_3a0 + 1;
      cVar14.End._M_current = local_330._M_current;
      cVar14.Begin._M_current = local_3b8._M_current + 1;
    } while (local_3b8._M_current + 1 != local_330._M_current);
  }
  pcVar7 = cmMakefile::GetCMakeInstance(this->Makefile);
  cmake::GetDebugConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2b0,pcVar7);
  if (config->_M_string_length == 0) {
    cVar12 = OPTIMIZED_LibraryType;
  }
  else {
    cmsys::SystemTools::UpperCase((string *)local_270,config);
    _Var9 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (local_2b0.Backtrace.Context.Name._M_dataplus._M_p,
                       local_2b0.Backtrace.Context.Name._M_string_length,local_270);
    if ((undefined1 *)local_270._0_8_ != local_260) {
      operator_delete((void *)local_270._0_8_,CONCAT71(local_260._1_7_,local_260[0]) + 1);
    }
    cVar12 = (_Var9._M_current ==
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_2b0.Backtrace.Context.Name._M_string_length) + DEBUG_LibraryType;
  }
  pcVar1 = this->Target;
  item = (pcVar1->OriginalLinkLibraries).
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  ppVar11 = (pcVar1->OriginalLinkLibraries).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (item != ppVar11) {
    local_3a8 = (cmOptionalLinkImplementation *)
                &(local_3a8->super_cmLinkImplementation).super_cmLinkImplementationLibraries.
                 WrongConfigLibraries;
    do {
      if ((item->second != GENERAL_LibraryType) && (item->second != cVar12)) {
        CheckCMP0004((string *)local_f8,this,&item->first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._8_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(this->Target->Name)._M_string_length) {
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_f8._8_8_ !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0) &&
             (iVar3 = bcmp((void *)local_f8._0_8_,(this->Target->Name)._M_dataplus._M_p,
                           local_f8._8_8_), iVar3 != 0)) {
LAB_003e7f73:
            pcVar10 = FindTargetToLink(this,(string *)local_f8);
            local_270._0_8_ = local_260;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_270,local_f8._0_8_,(char *)(local_f8._8_8_ + local_f8._0_8_))
            ;
            local_260._16_8_ = pcVar10;
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                      ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_3a8,
                       (cmLinkItem *)local_270);
            if ((undefined1 *)local_270._0_8_ != local_260) {
              operator_delete((void *)local_270._0_8_,CONCAT71(local_260._1_7_,local_260[0]) + 1);
            }
          }
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_f8._8_8_ !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0) goto LAB_003e7f73;
        if ((cmGeneratorExpressionDAGChecker *)local_f8._0_8_ !=
            (cmGeneratorExpressionDAGChecker *)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
        }
        ppVar11 = (pcVar1->OriginalLinkLibraries).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      item = item + 1;
    } while (item != ppVar11);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2b0);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkImplementationLibraries(
  const std::string& config,
  cmOptionalLinkImplementation& impl,
  cmGeneratorTarget const* head) const
{
  cmStringRange entryRange =
      this->Target->GetLinkImplementationEntries();
  cmBacktraceRange btRange =
      this->Target->GetLinkImplementationBacktraces();
  cmBacktraceRange::const_iterator btIt = btRange.begin();
  // Collect libraries directly linked in this configuration.
  for (cmStringRange::const_iterator le = entryRange.begin(),
      end = entryRange.end(); le != end; ++le, ++btIt)
    {
    std::vector<std::string> llibs;
    cmGeneratorExpressionDAGChecker dagChecker(
                                        this->GetName(),
                                        "LINK_LIBRARIES", 0, 0);
    cmGeneratorExpression ge(*btIt);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> const cge =
      ge.Parse(*le);
    std::string const evaluated =
      cge->Evaluate(this->LocalGenerator, config, false, head, &dagChecker);
    cmSystemTools::ExpandListArgument(evaluated, llibs);
    if(cge->GetHadHeadSensitiveCondition())
      {
      impl.HadHeadSensitiveCondition = true;
      }

    for(std::vector<std::string>::const_iterator li = llibs.begin();
        li != llibs.end(); ++li)
      {
      // Skip entries that resolve to the target itself or are empty.
      std::string name = this->CheckCMP0004(*li);
      if(name == this->GetName() || name.empty())
        {
        if(name == this->GetName())
          {
          bool noMessage = false;
          cmake::MessageType messageType = cmake::FATAL_ERROR;
          std::ostringstream e;
          switch(this->GetPolicyStatusCMP0038())
            {
            case cmPolicies::WARN:
              {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0038) << "\n";
              messageType = cmake::AUTHOR_WARNING;
              }
              break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
            }

          if(!noMessage)
            {
            e << "Target \"" << this->GetName() << "\" links to itself.";
            this->LocalGenerator->GetCMakeInstance()->IssueMessage(
              messageType, e.str(), this->GetBacktrace());
            if (messageType == cmake::FATAL_ERROR)
              {
              return;
              }
            }
          }
        continue;
        }

      // The entry is meant for this configuration.
      impl.Libraries.push_back(
        cmLinkImplItem(name, this->FindTargetToLink(name),
                       *btIt, evaluated != *le));
      }

    std::set<std::string> const& seenProps = cge->GetSeenTargetProperties();
    for (std::set<std::string>::const_iterator it = seenProps.begin();
        it != seenProps.end(); ++it)
      {
      if (!this->GetProperty(*it))
        {
        this->LinkImplicitNullProperties.insert(*it);
        }
      }
    cge->GetMaxLanguageStandard(this,
                                this->MaxLanguageStandards);
    }

  // Get the list of configurations considered to be DEBUG.
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();

  cmTargetLinkLibraryType linkType =
      CMP0003_ComputeLinkType(config, debugConfigs);
  cmTarget::LinkLibraryVectorType const& oldllibs =
    this->Target->GetOriginalLinkLibraries();
  for(cmTarget::LinkLibraryVectorType::const_iterator li = oldllibs.begin();
      li != oldllibs.end(); ++li)
    {
    if(li->second != GENERAL_LibraryType && li->second != linkType)
      {
      std::string name = this->CheckCMP0004(li->first);
      if(name == this->GetName() || name.empty())
        {
        continue;
        }
      // Support OLD behavior for CMP0003.
      impl.WrongConfigLibraries.push_back(
        cmLinkItem(name, this->FindTargetToLink(name)));
      }
    }
}